

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TraceBuffer::CopyChunkUntrusted
          (TraceBuffer *this,ProducerID producer_id_trusted,uid_t producer_uid_trusted,
          pid_t producer_pid_trusted,WriterID writer_id,ChunkID chunk_id,uint16_t num_fragments,
          uint8_t chunk_flags,bool chunk_complete,uint8_t *src,size_t size)

{
  ChunkMap *this_00;
  _Rb_tree_header *p_Var1;
  BufferStats *this_01;
  uint8_t *puVar2;
  uint8_t *puVar3;
  _Base_ptr wptr;
  uint64_t uVar4;
  Key KVar5;
  bool bVar6;
  iterator iVar7;
  size_t size_00;
  mapped_type *pmVar8;
  iterator iVar9;
  ssize_t sVar10;
  char *pcVar11;
  char *bytes_to_clear;
  ChunkRecord local_88;
  pair<unsigned_short,_unsigned_short> producer_and_writer_id;
  ChunkID CStack_74;
  Key key;
  
  pcVar11 = (char *)(size + 0x1f & 0xfffffffffffffff0);
  if ((char *)this->max_chunk_size_ < pcVar11) {
    protos::gen::TraceStats_BufferStats::set_abi_violations
              (&this->stats_,(this->stats_).abi_violations_ + 1);
    return;
  }
  if (!chunk_complete) {
    if (num_fragments == 0) {
      num_fragments = 0;
    }
    else {
      num_fragments = num_fragments - 1;
      chunk_flags = chunk_flags & 0xf9;
    }
  }
  local_88.unused[0] = 'C';
  local_88.unused[1] = 'H';
  local_88.unused[2] = 'U';
  local_88.size = (uint16_t)pcVar11;
  local_88._12_1_ = chunk_flags & 0x3f;
  this_00 = &this->index_;
  local_88.chunk_id = chunk_id;
  local_88.producer_id = producer_id_trusted;
  local_88.writer_id = writer_id;
  local_88.num_fragments = num_fragments;
  key.producer_id = producer_id_trusted;
  key.writer_id = writer_id;
  key.chunk_id = chunk_id;
  iVar7 = std::
          _Rb_tree<perfetto::TraceBuffer::ChunkMeta::Key,_std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>,_std::_Select1st<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>,_std::less<perfetto::TraceBuffer::ChunkMeta::Key>,_std::allocator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>_>
          ::find(&this_00->_M_t,&key);
  p_Var1 = &(this->index_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
    wptr = iVar7._M_node[1]._M_parent;
    _producer_and_writer_id = (Key)(*(ulong *)wptr << 0x20 | *(ulong *)wptr >> 0x20);
    bVar6 = ChunkMeta::Key::operator!=((Key *)&producer_and_writer_id,&key);
    if ((((!bVar6) && (pcVar11 == (char *)(ulong)*(ushort *)((long)&wptr->_M_parent + 2))) &&
        (*(ushort *)&wptr->_M_parent <= num_fragments)) &&
       ((~chunk_flags & *(byte *)((long)&wptr->_M_parent + 4) & 0x3f) == 0)) {
      if (*(ushort *)&wptr->_M_parent == num_fragments) {
        return;
      }
      producer_and_writer_id.second = key.writer_id;
      producer_and_writer_id.first = key.producer_id;
      CStack_74 = key.chunk_id + 1;
      iVar9 = std::
              _Rb_tree<perfetto::TraceBuffer::ChunkMeta::Key,_std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>,_std::_Select1st<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>,_std::less<perfetto::TraceBuffer::ChunkMeta::Key>,_std::allocator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>_>
              ::find(&this_00->_M_t,(key_type *)&producer_and_writer_id);
      if (((_Rb_tree_header *)iVar9._M_node == p_Var1) ||
         (*(short *)((long)&iVar9._M_node[1]._M_right + 4) == 0)) {
        if (*(ushort *)&wptr->_M_parent < *(ushort *)((long)&iVar7._M_node[1]._M_right + 4)) {
          pcVar11 = base::Basename(
                                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                                  );
          base::LogMessage(kLogError,pcVar11,0xc33a,
                           "TraceBuffer read too many fragments from an incomplete chunk");
          return;
        }
        *(uint16_t *)((long)&iVar7._M_node[1]._M_right + 2) = num_fragments;
        *(uint8_t *)((long)&iVar7._M_node[1]._M_right + 1) = chunk_flags;
        *(byte *)&iVar7._M_node[1]._M_right =
             (*(byte *)&iVar7._M_node[1]._M_right & 0xfe) + chunk_complete;
        WriteChunkRecord(this,(uint8_t *)wptr,&local_88,src,size);
        protos::gen::TraceStats_BufferStats::set_chunks_rewritten
                  (&this->stats_,(this->stats_).chunks_rewritten_ + 1);
        return;
      }
    }
    protos::gen::TraceStats_BufferStats::set_abi_violations
              (&this->stats_,(this->stats_).abi_violations_ + 1);
    return;
  }
  if (this->discard_writes_ != true) {
    bytes_to_clear = (this->data_).p_ + (this->size_ - (long)this->wptr_);
    if (bytes_to_clear < pcVar11) {
      sVar10 = DeleteNextChunksFor(this,(size_t)bytes_to_clear);
      if (sVar10 == -1) goto LAB_002f5f9d;
      AddPaddingRecord(this,(size_t)bytes_to_clear);
      uVar4 = (this->stats_).write_wrap_count_;
      this->wptr_ = (uint8_t *)(this->data_).p_;
      protos::gen::TraceStats_BufferStats::set_write_wrap_count(&this->stats_,uVar4 + 1);
    }
    size_00 = DeleteNextChunksFor(this,(size_t)pcVar11);
    if (size_00 != 0xffffffffffffffff) {
      this_01 = &this->stats_;
      protos::gen::TraceStats_BufferStats::set_chunks_written
                (this_01,(this->stats_).chunks_written_ + 1);
      protos::gen::TraceStats_BufferStats::set_bytes_written
                (this_01,(uint64_t)(pcVar11 + (this->stats_).bytes_written_));
      _producer_and_writer_id = (Key)this->wptr_;
      ::std::
      _Rb_tree<perfetto::TraceBuffer::ChunkMeta::Key,std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>,std::_Select1st<std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>>,std::less<perfetto::TraceBuffer::ChunkMeta::Key>,std::allocator<std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>>>
      ::_M_emplace_unique<perfetto::TraceBuffer::ChunkMeta::Key&,perfetto::TraceBuffer::ChunkMeta>
                ((_Rb_tree<perfetto::TraceBuffer::ChunkMeta::Key,std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>,std::_Select1st<std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>>,std::less<perfetto::TraceBuffer::ChunkMeta::Key>,std::allocator<std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>>>
                  *)this_00,&key,(ChunkMeta *)&producer_and_writer_id);
      WriteChunkRecord(this,this->wptr_,&local_88,src,size);
      puVar2 = this->wptr_;
      this->wptr_ = puVar2 + (long)pcVar11;
      puVar3 = (uint8_t *)(this->data_).p_;
      if (puVar3 + this->size_ <= puVar2 + (long)pcVar11) {
        this->wptr_ = puVar3;
        protos::gen::TraceStats_BufferStats::set_write_wrap_count
                  (this_01,(this->stats_).write_wrap_count_ + 1);
      }
      KVar5 = _producer_and_writer_id;
      producer_and_writer_id.second = writer_id;
      producer_and_writer_id.first = producer_id_trusted;
      CStack_74 = KVar5.chunk_id;
      pmVar8 = std::
               map<std::pair<unsigned_short,_unsigned_short>,_unsigned_int,_std::less<std::pair<unsigned_short,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_short,_unsigned_short>,_unsigned_int>_>_>
               ::operator[](&this->last_chunk_id_written_,&producer_and_writer_id);
      if (chunk_id - *pmVar8 < 0x7fffffff) {
        *pmVar8 = chunk_id;
      }
      else {
        protos::gen::TraceStats_BufferStats::set_chunks_committed_out_of_order
                  (this_01,(this->stats_).chunks_committed_out_of_order_ + 1);
      }
      if (size_00 == 0) {
        return;
      }
      AddPaddingRecord(this,size_00);
      return;
    }
  }
LAB_002f5f9d:
  DiscardWrite(this);
  return;
}

Assistant:

void TraceBuffer::CopyChunkUntrusted(ProducerID producer_id_trusted,
                                     uid_t producer_uid_trusted,
                                     pid_t producer_pid_trusted,
                                     WriterID writer_id,
                                     ChunkID chunk_id,
                                     uint16_t num_fragments,
                                     uint8_t chunk_flags,
                                     bool chunk_complete,
                                     const uint8_t* src,
                                     size_t size) {
  // |record_size| = |size| + sizeof(ChunkRecord), rounded up to avoid to end
  // up in a fragmented state where size_to_end() < sizeof(ChunkRecord).
  const size_t record_size =
      base::AlignUp<sizeof(ChunkRecord)>(size + sizeof(ChunkRecord));
  if (PERFETTO_UNLIKELY(record_size > max_chunk_size_)) {
    stats_.set_abi_violations(stats_.abi_violations() + 1);
    PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
    return;
  }

  TRACE_BUFFER_DLOG("CopyChunk @ %lu, size=%zu", wptr_ - begin(), record_size);

#if PERFETTO_DCHECK_IS_ON()
  changed_since_last_read_ = true;
#endif

  // If the chunk hasn't been completed, we should only consider the first
  // |num_fragments - 1| packets complete. For simplicity, we simply disregard
  // the last one when we copy the chunk.
  if (PERFETTO_UNLIKELY(!chunk_complete)) {
    if (num_fragments > 0) {
      num_fragments--;
      // These flags should only affect the last packet in the chunk. We clear
      // them, so that TraceBuffer is able to look at the remaining packets in
      // this chunk.
      chunk_flags &= ~kLastPacketContinuesOnNextChunk;
      chunk_flags &= ~kChunkNeedsPatching;
    }
  }

  ChunkRecord record(record_size);
  record.producer_id = producer_id_trusted;
  record.chunk_id = chunk_id;
  record.writer_id = writer_id;
  record.num_fragments = num_fragments;
  record.flags = chunk_flags;
  ChunkMeta::Key key(record);

  // Check whether we have already copied the same chunk previously. This may
  // happen if the service scrapes chunks in a potentially incomplete state
  // before receiving commit requests for them from the producer. Note that the
  // service may scrape and thus override chunks in arbitrary order since the
  // chunks aren't ordered in the SMB.
  const auto it = index_.find(key);
  if (PERFETTO_UNLIKELY(it != index_.end())) {
    ChunkMeta* record_meta = &it->second;
    ChunkRecord* prev = record_meta->chunk_record;

    // Verify that the old chunk's metadata corresponds to the new one.
    // Overridden chunks should never change size, since the page layout is
    // fixed per writer. The number of fragments should also never decrease and
    // flags should not be removed.
    if (PERFETTO_UNLIKELY(ChunkMeta::Key(*prev) != key ||
                          prev->size != record_size ||
                          prev->num_fragments > num_fragments ||
                          (prev->flags & chunk_flags) != prev->flags)) {
      stats_.set_abi_violations(stats_.abi_violations() + 1);
      PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
      return;
    }

    // If this chunk was previously copied with the same number of fragments and
    // the number didn't change, there's no need to copy it again. If the
    // previous chunk was complete already, this should always be the case.
    PERFETTO_DCHECK(suppress_client_dchecks_for_testing_ ||
                    !record_meta->is_complete() ||
                    (chunk_complete && prev->num_fragments == num_fragments));
    if (prev->num_fragments == num_fragments) {
      TRACE_BUFFER_DLOG("  skipping recommit of identical chunk");
      return;
    }

    // If we've already started reading from chunk N+1 following this chunk N,
    // don't override chunk N. Otherwise we may end up reading a packet from
    // chunk N after having read from chunk N+1, thereby violating sequential
    // read of packets. This shouldn't happen if the producer is well-behaved,
    // because it shouldn't start chunk N+1 before completing chunk N.
    ChunkMeta::Key subsequent_key = key;
    static_assert(std::numeric_limits<ChunkID>::max() == kMaxChunkID,
                  "ChunkID wraps");
    subsequent_key.chunk_id++;
    const auto subsequent_it = index_.find(subsequent_key);
    if (subsequent_it != index_.end() &&
        subsequent_it->second.num_fragments_read > 0) {
      stats_.set_abi_violations(stats_.abi_violations() + 1);
      PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
      return;
    }

    // We should not have read past the last packet.
    if (record_meta->num_fragments_read > prev->num_fragments) {
      PERFETTO_ELOG(
          "TraceBuffer read too many fragments from an incomplete chunk");
      PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
      return;
    }

    uint8_t* wptr = reinterpret_cast<uint8_t*>(prev);
    TRACE_BUFFER_DLOG("  overriding chunk @ %lu, size=%zu", wptr - begin(),
                      record_size);

    // Update chunk meta data stored in the index, as it may have changed.
    record_meta->num_fragments = num_fragments;
    record_meta->flags = chunk_flags;
    record_meta->set_complete(chunk_complete);

    // Override the ChunkRecord contents at the original |wptr|.
    TRACE_BUFFER_DLOG("  copying @ [%lu - %lu] %zu", wptr - begin(),
                      uintptr_t(wptr - begin()) + record_size, record_size);
    WriteChunkRecord(wptr, record, src, size);
    TRACE_BUFFER_DLOG("Chunk raw: %s",
                      base::HexDump(wptr, record_size).c_str());
    stats_.set_chunks_rewritten(stats_.chunks_rewritten() + 1);
    return;
  }

  if (PERFETTO_UNLIKELY(discard_writes_))
    return DiscardWrite();

  // If there isn't enough room from the given write position. Write a padding
  // record to clear the end of the buffer and wrap back.
  const size_t cached_size_to_end = size_to_end();
  if (PERFETTO_UNLIKELY(record_size > cached_size_to_end)) {
    ssize_t res = DeleteNextChunksFor(cached_size_to_end);
    if (res == -1)
      return DiscardWrite();
    PERFETTO_DCHECK(static_cast<size_t>(res) <= cached_size_to_end);
    AddPaddingRecord(cached_size_to_end);
    wptr_ = begin();
    stats_.set_write_wrap_count(stats_.write_wrap_count() + 1);
    PERFETTO_DCHECK(size_to_end() >= record_size);
  }

  // At this point either |wptr_| points to an untouched part of the buffer
  // (i.e. *wptr_ == 0) or we are about to overwrite one or more ChunkRecord(s).
  // In the latter case we need to first figure out where the next valid
  // ChunkRecord is (if it exists) and add padding between the new record.
  // Example ((w) == write cursor):
  //
  // Initial state (wtpr_ == 0):
  // |0 (w)    |10               |30                  |50
  // +---------+-----------------+--------------------+--------------------+
  // | Chunk 1 | Chunk 2         | Chunk 3            | Chunk 4            |
  // +---------+-----------------+--------------------+--------------------+
  //
  // Let's assume we now want now write a 5th Chunk of size == 35. The final
  // state should look like this:
  // |0                                |35 (w)         |50
  // +---------------------------------+---------------+--------------------+
  // | Chunk 5                         | Padding Chunk | Chunk 4            |
  // +---------------------------------+---------------+--------------------+

  // Deletes all chunks from |wptr_| to |wptr_| + |record_size|.
  ssize_t del_res = DeleteNextChunksFor(record_size);
  if (del_res == -1)
    return DiscardWrite();
  size_t padding_size = static_cast<size_t>(del_res);

  // Now first insert the new chunk. At the end, if necessary, add the padding.
  stats_.set_chunks_written(stats_.chunks_written() + 1);
  stats_.set_bytes_written(stats_.bytes_written() + record_size);
  auto it_and_inserted = index_.emplace(
      key, ChunkMeta(GetChunkRecordAt(wptr_), num_fragments, chunk_complete,
                     chunk_flags, producer_uid_trusted, producer_pid_trusted));
  PERFETTO_DCHECK(it_and_inserted.second);
  TRACE_BUFFER_DLOG("  copying @ [%lu - %lu] %zu", wptr_ - begin(),
                    uintptr_t(wptr_ - begin()) + record_size, record_size);
  WriteChunkRecord(wptr_, record, src, size);
  TRACE_BUFFER_DLOG("Chunk raw: %s", base::HexDump(wptr_, record_size).c_str());
  wptr_ += record_size;
  if (wptr_ >= end()) {
    PERFETTO_DCHECK(padding_size == 0);
    wptr_ = begin();
    stats_.set_write_wrap_count(stats_.write_wrap_count() + 1);
  }
  DcheckIsAlignedAndWithinBounds(wptr_);

  // Chunks may be received out of order, so only update last_chunk_id if the
  // new chunk_id is larger. But take into account overflows by only selecting
  // the new ID if its distance to the latest ID is smaller than half the number
  // space.
  //
  // This accounts for both the case where the new ID has just overflown and
  // last_chunk_id be updated even though it's smaller (e.g. |chunk_id| = 1 and
  // |last_chunk_id| = kMaxChunkId; chunk_id - last_chunk_id = 0) and the case
  // where the new ID is an out-of-order ID right after an overflow and
  // last_chunk_id shouldn't be updated even though it's larger (e.g. |chunk_id|
  // = kMaxChunkId and |last_chunk_id| = 1; chunk_id - last_chunk_id =
  // kMaxChunkId - 1).
  auto producer_and_writer_id = std::make_pair(producer_id_trusted, writer_id);
  ChunkID& last_chunk_id = last_chunk_id_written_[producer_and_writer_id];
  static_assert(std::numeric_limits<ChunkID>::max() == kMaxChunkID,
                "This code assumes that ChunkID wraps at kMaxChunkID");
  if (chunk_id - last_chunk_id < kMaxChunkID / 2) {
    last_chunk_id = chunk_id;
  } else {
    stats_.set_chunks_committed_out_of_order(
        stats_.chunks_committed_out_of_order() + 1);
  }

  if (padding_size)
    AddPaddingRecord(padding_size);
}